

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O1

void * nn_chunk_trim(void *p,size_t n)

{
  nn_chunk *pnVar1;
  void *pvVar2;
  ulong uVar3;
  
  pnVar1 = nn_chunk_getptr(p);
  if (pnVar1->size < n) {
    nn_chunk_trim_cold_2();
  }
  else {
    pvVar2 = (void *)((long)p + n);
    nn_putl((uint8_t *)((long)p + (n - 4)),0xdeadcafe);
    uVar3 = (long)pvVar2 + (-0x20 - (long)pnVar1);
    if (uVar3 < 0xffffffff) {
      nn_putl((uint8_t *)((long)pvVar2 + -8),(uint32_t)uVar3);
      pnVar1->size = pnVar1->size - n;
      return pvVar2;
    }
  }
  nn_chunk_trim_cold_1();
}

Assistant:

void *nn_chunk_trim (void *p, size_t n)
{
    struct nn_chunk *self;
    const size_t hdrsz = sizeof (struct nn_chunk) + 2 * sizeof (uint32_t);
    size_t empty_space;

    self = nn_chunk_getptr (p);

    /*  Sanity check. We cannot trim more bytes than there are in the chunk. */
    nn_assert (n <= self->size);

    /*  Adjust the chunk header. */
    p = ((uint8_t*) p) + n;
    nn_putl ((uint8_t*) (((uint32_t*) p) - 1), NN_CHUNK_TAG);
    empty_space = (uint8_t*) p - (uint8_t*) self - hdrsz;
    nn_assert(empty_space < UINT32_MAX);
    nn_putl ((uint8_t*) (((uint32_t*) p) - 2), (uint32_t) empty_space);

    /*  Adjust the size of the message. */
    self->size -= n;

    return p;
}